

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O1

void TIFFSwabArrayOfFloat(float *fp,tmsize_t n)

{
  ushort *puVar1;
  undefined1 uVar2;
  long lVar3;
  undefined1 *puVar4;
  
  if (0 < n) {
    puVar4 = (undefined1 *)((long)fp + 3);
    lVar3 = n + 1;
    do {
      uVar2 = *puVar4;
      *puVar4 = puVar4[-3];
      puVar4[-3] = uVar2;
      puVar1 = (ushort *)(puVar4 + -2);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      puVar4 = puVar4 + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  return;
}

Assistant:

void TIFFSwabArrayOfFloat(register float *fp, tmsize_t n)
{
    register unsigned char *cp;
    register unsigned char t;
    assert(sizeof(float) == 4);
    /* XXX unroll loop some */
    while (n-- > 0)
    {
        cp = (unsigned char *)fp;
        t = cp[3];
        cp[3] = cp[0];
        cp[0] = t;
        t = cp[2];
        cp[2] = cp[1];
        cp[1] = t;
        fp++;
    }
}